

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall IRBuilder::CheckBailOutInjection(IRBuilder *this,OpCode opcode)

{
  code *pcVar1;
  int iVar2;
  bool bVar3;
  undefined4 *puVar4;
  undefined6 in_register_00000032;
  
  iVar2 = (int)CONCAT62(in_register_00000032,opcode);
  if (iVar2 - 0x1dU < 2) {
    if (this->seenProfiledBeginSwitch == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0xe0,"(!seenProfiledBeginSwitch)","!seenProfiledBeginSwitch");
      if (!bVar3) goto LAB_00489de4;
      *puVar4 = 0;
    }
    this->seenProfiledBeginSwitch = true;
  }
  else {
    if (iVar2 == 0x1b) {
      if (this->seenProfiledBeginSwitch == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0xe4,"(seenProfiledBeginSwitch)","seenProfiledBeginSwitch");
        if (!bVar3) goto LAB_00489de4;
        *puVar4 = 0;
      }
      this->seenProfiledBeginSwitch = false;
      return;
    }
    if (iVar2 == 0x2c) {
      if (this->seenLdStackArgPtr == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0xd8,"(seenLdStackArgPtr)","seenLdStackArgPtr");
        if (!bVar3) goto LAB_00489de4;
        *puVar4 = 0;
      }
      if (this->expectApplyArg == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0xd9,"(expectApplyArg)","expectApplyArg");
        if (!bVar3) goto LAB_00489de4;
        *puVar4 = 0;
      }
      this->seenLdStackArgPtr = false;
      this->expectApplyArg = false;
      return;
    }
    if (iVar2 == 0xaf) {
      if (this->seenLdStackArgPtr == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0xd3,"(seenLdStackArgPtr)","seenLdStackArgPtr");
        if (!bVar3) goto LAB_00489de4;
        *puVar4 = 0;
      }
      if (this->expectApplyArg == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0xd4,"(!expectApplyArg)","!expectApplyArg");
        if (!bVar3) goto LAB_00489de4;
        *puVar4 = 0;
      }
      this->expectApplyArg = true;
      return;
    }
    if (iVar2 != 0x15b) {
      if (this->seenLdStackArgPtr == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0xe9,"(!seenLdStackArgPtr)","!seenLdStackArgPtr");
        if (!bVar3) goto LAB_00489de4;
        *puVar4 = 0;
      }
      if (this->expectApplyArg != true) {
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0xea,"(!expectApplyArg)","!expectApplyArg");
      if (bVar3) {
        *puVar4 = 0;
        return;
      }
LAB_00489de4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    if (this->seenLdStackArgPtr == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0xce,"(!seenLdStackArgPtr)","!seenLdStackArgPtr");
      if (!bVar3) goto LAB_00489de4;
      *puVar4 = 0;
    }
    if (this->expectApplyArg == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0xcf,"(!expectApplyArg)","!expectApplyArg");
      if (!bVar3) goto LAB_00489de4;
      *puVar4 = 0;
    }
    this->seenLdStackArgPtr = true;
  }
  return;
}

Assistant:

void
IRBuilder::CheckBailOutInjection(Js::OpCode opcode)
{
    // Detect these sequence and disable Bailout injection between them:
    //   LdStackArgPtr
    //   LdArgCnt
    //   ApplyArgs
    // This assumes that LdStackArgPtr, LdArgCnt and ApplyArgs can
    // only be emitted in these sequence. This will need to be modified if it changes.
    //
    // Also insert a single bailout before the beginning of a switch case block for all the case labels.
    switch(opcode)
    {
    case Js::OpCode::LdStackArgPtr:
        Assert(!seenLdStackArgPtr);
        Assert(!expectApplyArg);
        seenLdStackArgPtr = true;
        break;
    case Js::OpCode::LdArgCnt:
        Assert(seenLdStackArgPtr);
        Assert(!expectApplyArg);
        expectApplyArg = true;
        break;
    case Js::OpCode::ApplyArgs:
        Assert(seenLdStackArgPtr);
        Assert(expectApplyArg);
        seenLdStackArgPtr = false;
        expectApplyArg = false;
        break;

    case Js::OpCode::BeginSwitch:
    case Js::OpCode::ProfiledBeginSwitch:
        Assert(!seenProfiledBeginSwitch);
        seenProfiledBeginSwitch = true;
        break;
    case Js::OpCode::EndSwitch:
        Assert(seenProfiledBeginSwitch);
        seenProfiledBeginSwitch = false;
        break;

    default:
        Assert(!seenLdStackArgPtr);
        Assert(!expectApplyArg);
        break;
    }
}